

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GravityCompensationHelpers.cpp
# Opt level: O0

void __thiscall
iDynTree::GravityCompensationHelper::allocKinematicTraversals
          (GravityCompensationHelper *this,size_t nrOfLinks)

{
  size_type sVar1;
  Traversal *this_00;
  reference ppTVar2;
  long in_RDI;
  size_t link;
  size_type in_stack_ffffffffffffffd8;
  vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_> *in_stack_ffffffffffffffe0;
  undefined8 local_18;
  
  std::vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>::resize
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>::size
                      ((vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_> *)
                       (in_RDI + 0x198));
    if (sVar1 <= local_18) break;
    this_00 = (Traversal *)operator_new(0x60);
    iDynTree::Traversal::Traversal(this_00);
    ppTVar2 = std::vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>::operator[]
                        ((vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_> *)
                         (in_RDI + 0x198),local_18);
    *ppTVar2 = this_00;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void GravityCompensationHelper::allocKinematicTraversals(const size_t nrOfLinks)
  {
    m_kinematicTraversals.resize(nrOfLinks);
    for (size_t link = 0; link < m_kinematicTraversals.size(); link++)
    {
      m_kinematicTraversals[link] = new iDynTree::Traversal;
    }
  }